

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmAbc.c
# Opt level: O0

int Mpm_ManNodeIfToGia_rec
              (Gia_Man_t *pNew,Mpm_Man_t *pMan,Mig_Obj_t *pObj,Vec_Ptr_t *vVisited,int fHash)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int c;
  Mpm_Cut_t *pCut_00;
  Mig_Obj_t *pMVar5;
  int local_58;
  int iFunc2;
  int iFunc1;
  int iFunc0;
  int iFunc;
  Mpm_Cut_t *pCut;
  Mig_Obj_t *pTemp;
  int fHash_local;
  Vec_Ptr_t *vVisited_local;
  Mig_Obj_t *pObj_local;
  Mpm_Man_t *pMan_local;
  Gia_Man_t *pNew_local;
  
  local_58 = 0;
  if (fHash != 0) {
    __assert_fail("fHash == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/mpm/mpmAbc.c"
                  ,0x82,
                  "int Mpm_ManNodeIfToGia_rec(Gia_Man_t *, Mpm_Man_t *, Mig_Obj_t *, Vec_Ptr_t *, int)"
                 );
  }
  pCut_00 = Mpm_ObjCutBestP(pMan,pObj);
  uVar1 = Mpm_CutDataInt(pCut_00);
  if (uVar1 == 0) {
    Vec_PtrPush(vVisited,pCut_00);
    Mpm_CutSetDataInt(pCut_00,-1);
    iVar2 = Mig_ObjIsCi(pObj);
    pCut = (Mpm_Cut_t *)pObj;
    if (iVar2 == 0) {
      for (; pCut != (Mpm_Cut_t *)0x0; pCut = (Mpm_Cut_t *)Mig_ObjSibl((Mig_Obj_t *)pCut)) {
        pMVar5 = Mig_ObjFanin0((Mig_Obj_t *)pCut);
        iVar2 = Mpm_ManNodeIfToGia_rec(pNew,pMan,pMVar5,vVisited,0);
        if (iVar2 != -1) {
          pMVar5 = Mig_ObjFanin1((Mig_Obj_t *)pCut);
          iVar3 = Mpm_ManNodeIfToGia_rec(pNew,pMan,pMVar5,vVisited,0);
          if (iVar3 != -1) {
            iVar4 = Mig_ObjIsNode3((Mig_Obj_t *)pCut);
            if (iVar4 != 0) {
              pMVar5 = Mig_ObjFanin2((Mig_Obj_t *)pCut);
              iVar4 = Mpm_ManNodeIfToGia_rec(pNew,pMan,pMVar5,vVisited,0);
              if (iVar4 == -1) {
                local_58 = -1;
                goto LAB_00b2f4a8;
              }
              c = Mig_ObjFaninC2((Mig_Obj_t *)pCut);
              local_58 = Abc_LitNotCond(iVar4,c);
            }
            iVar4 = Mig_ObjFaninC0((Mig_Obj_t *)pCut);
            iVar2 = Abc_LitNotCond(iVar2,iVar4);
            iVar4 = Mig_ObjFaninC1((Mig_Obj_t *)pCut);
            iVar3 = Abc_LitNotCond(iVar3,iVar4);
            iVar4 = Mig_ObjIsMux((Mig_Obj_t *)pCut);
            if (iVar4 == 0) {
              iVar4 = Mig_ObjIsXor((Mig_Obj_t *)pCut);
              if (iVar4 == 0) {
                iFunc1 = Gia_ManAppendAnd(pNew,iVar2,iVar3);
              }
              else {
                iFunc1 = Gia_ManAppendXor(pNew,iVar2,iVar3);
              }
            }
            else {
              iFunc1 = Gia_ManAppendMux(pNew,local_58,iVar3,iVar2);
            }
            iVar2 = Mig_ObjPhase((Mig_Obj_t *)pCut);
            iVar3 = Mig_ObjPhase(pObj);
            if (iVar2 != iVar3) {
              iFunc1 = Abc_LitNot(iFunc1);
            }
            Mpm_CutSetDataInt(pCut_00,iFunc1);
            break;
          }
        }
LAB_00b2f4a8:
      }
      pNew_local._4_4_ = Mpm_CutDataInt(pCut_00);
    }
    else {
      pNew_local._4_4_ = Mpm_CutDataInt(pCut_00);
    }
  }
  else {
    pNew_local._4_4_ = Mpm_CutDataInt(pCut_00);
  }
  return pNew_local._4_4_;
}

Assistant:

int Mpm_ManNodeIfToGia_rec( Gia_Man_t * pNew, Mpm_Man_t * pMan, Mig_Obj_t * pObj, Vec_Ptr_t * vVisited, int fHash )
{
    Mig_Obj_t * pTemp;
    Mpm_Cut_t * pCut;
    int iFunc, iFunc0, iFunc1, iFunc2 = 0;
    assert( fHash == 0 );
    // get the best cut
    pCut = Mpm_ObjCutBestP( pMan, pObj );
    // if the cut is visited, return the result
    if ( Mpm_CutDataInt(pCut) )
        return Mpm_CutDataInt(pCut);
    // mark the node as visited
    Vec_PtrPush( vVisited, pCut );
    // insert the worst case
    Mpm_CutSetDataInt( pCut, ~0 );
    // skip in case of primary input
    if ( Mig_ObjIsCi(pObj) )
        return Mpm_CutDataInt(pCut);
    // compute the functions of the children
    for ( pTemp = pObj; pTemp; pTemp = Mig_ObjSibl(pTemp) )
    {
        iFunc0 = Mpm_ManNodeIfToGia_rec( pNew, pMan, Mig_ObjFanin0(pTemp), vVisited, fHash );
        if ( iFunc0 == ~0 )
            continue;
        iFunc1 = Mpm_ManNodeIfToGia_rec( pNew, pMan, Mig_ObjFanin1(pTemp), vVisited, fHash );
        if ( iFunc1 == ~0 )
            continue;
        if ( Mig_ObjIsNode3(pTemp) )
        {
            iFunc2 = Mpm_ManNodeIfToGia_rec( pNew, pMan, Mig_ObjFanin2(pTemp), vVisited, fHash );
            if ( iFunc2 == ~0 )
                continue;
            iFunc2 = Abc_LitNotCond(iFunc2, Mig_ObjFaninC2(pTemp));
        }
        iFunc0 = Abc_LitNotCond(iFunc0, Mig_ObjFaninC0(pTemp));
        iFunc1 = Abc_LitNotCond(iFunc1, Mig_ObjFaninC1(pTemp));
        // both branches are solved
        if ( fHash )
        {
            if ( Mig_ObjIsMux(pTemp) )
                iFunc = Gia_ManHashMux( pNew, iFunc2, iFunc1, iFunc0 );
            else if ( Mig_ObjIsXor(pTemp) )
                iFunc = Gia_ManHashXor( pNew, iFunc0, iFunc1 );
            else 
                iFunc = Gia_ManHashAnd( pNew, iFunc0, iFunc1 ); 
        }
        else
        {
            if ( Mig_ObjIsMux(pTemp) )
                iFunc = Gia_ManAppendMux( pNew, iFunc2, iFunc1, iFunc0 );
            else if ( Mig_ObjIsXor(pTemp) )
                iFunc = Gia_ManAppendXor( pNew, iFunc0, iFunc1 );
            else 
                iFunc = Gia_ManAppendAnd( pNew, iFunc0, iFunc1 ); 
        }
        if ( Mig_ObjPhase(pTemp) != Mig_ObjPhase(pObj) )
            iFunc = Abc_LitNot(iFunc);
        Mpm_CutSetDataInt( pCut, iFunc );
        break;
    }
    return Mpm_CutDataInt(pCut);
}